

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListIteratorTest_rbegin_rend_backward_Test::TestBody
          (IntrusiveListIteratorTest_rbegin_rend_backward_Test *this)

{
  bool bVar1;
  pointer pTVar2;
  int line;
  TestObject *expected;
  char *message;
  unsigned_long uVar3;
  int *lhs;
  long lVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  AssertionResult gtest_ar;
  _Vector_base<int,_std::allocator<int>_> local_b8;
  IntrusiveListIteratorTest_rbegin_rend_backward_Test *local_98;
  AssertHelper local_90;
  unsigned_long local_88;
  undefined8 local_7c;
  undefined4 local_74;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator> local_70;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_60
  ;
  TestObjectList *local_50;
  undefined8 local_48;
  iterator local_40;
  
  local_70.current.list_ = &(this->super_IntrusiveListIteratorTest).list_;
  local_70.current.node_ = (TestObject *)0x0;
  local_40.node_ = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_7c = 0x200000001;
  local_74 = 3;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = this;
  local_40.list_ = local_70.current.list_;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_b8,&local_7c);
  lVar4 = 0;
  uVar3 = 0;
  do {
    local_88 = uVar3;
    bVar1 = std::operator!=(&local_70,
                            (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                             *)&local_40);
    if (!bVar1) {
      local_d0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 2);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"count","expected.size()",&local_88,
                 (unsigned_long *)&local_d0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d0);
        if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
            (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
        }
        line = 0xb1;
LAB_001f5176:
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                   ,line,message);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_d0);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
      local_60.current.list_ = (local_98->super_IntrusiveListIteratorTest).clist_;
      local_48 = 0;
      expected = (local_60.current.list_)->first_;
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x2000000;
      gtest_ar.message_.ptr_._0_4_ = 3;
      local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_60.current.node_ = expected;
      local_50 = local_60.current.list_;
      std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
                ((vector<int,std::allocator<int>> *)&local_b8,&gtest_ar);
      (anonymous_namespace)::IntrusiveListIteratorTest::
      TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
                ((IntrusiveListIteratorTest *)&local_50,&local_60,
                 (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                  *)&local_b8,(vector<int,_std::allocator<int>_> *)expected);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
      return;
    }
    wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator::operator++(&local_40);
    lhs = (int *)((long)local_b8._M_impl.super__Vector_impl_data._M_start + lVar4);
    pTVar2 = std::
             reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>::
             operator->((reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                         *)&local_40);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"expected[count]","last->data",lhs,&pTVar2->data);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_d0);
      if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
          (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
      }
      line = 0xae;
      goto LAB_001f5176;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

TEST_F(IntrusiveListIteratorTest, rbegin_rend_backward) {
  TestBackward(list_.rbegin(), list_.rend(), {1, 2, 3});
  TestBackward(clist_.rbegin(), clist_.rend(), {1, 2, 3});
}